

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::iteratorAccessTest<false>(ViewTest *this)

{
  allocator<int> *paVar1;
  undefined1 *puVar2;
  reference pvVar3;
  iterator iVar4;
  iterator iVar5;
  reference piVar6;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *pIVar7;
  reference piVar8;
  reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_> *prVar9;
  reference piVar10;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar11;
  bool local_a81;
  iterator local_a80;
  bool local_a4e;
  bool local_a4d;
  int local_a4c;
  undefined1 local_a48 [4];
  int i_8;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_a18;
  undefined1 local_9e8 [8];
  const_iterator it_8;
  undefined1 local_9a0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_8;
  undefined1 local_958 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_8;
  reverse_iterator local_938;
  bool local_906;
  bool local_905;
  int local_904;
  undefined1 local_900 [4];
  int i_7;
  undefined1 local_8d0 [8];
  reverse_iterator it_7;
  undefined1 local_888 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_7;
  undefined1 local_840 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_7;
  iterator local_820;
  bool local_7ee;
  bool local_7ed;
  int local_7ec;
  undefined1 local_7e8 [4];
  int i_6;
  undefined1 local_7b8 [8];
  iterator it_6;
  undefined1 local_770 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_6;
  undefined1 local_728 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_6;
  iterator local_708;
  bool local_6d6;
  bool local_6d5;
  int local_6d4;
  undefined1 local_6d0 [4];
  int i_5;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_6a0;
  undefined1 local_670 [8];
  const_iterator it_5;
  undefined1 local_628 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_5;
  undefined1 local_5e0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  reverse_iterator local_5c0;
  bool local_58e;
  bool local_58d;
  int local_58c;
  undefined1 local_588 [4];
  int i_4;
  undefined1 local_558 [8];
  reverse_iterator it_4;
  undefined1 local_510 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_4;
  undefined1 local_4c8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  iterator local_4a8;
  bool local_476;
  bool local_475;
  int local_474;
  undefined1 local_470 [4];
  int i_3;
  undefined1 local_440 [8];
  iterator it_3;
  undefined1 local_3f8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_3;
  undefined1 local_3b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  iterator local_390;
  bool local_35e;
  bool local_35d;
  int local_35c;
  undefined1 local_358 [4];
  int i_2;
  Iterator<int,_true,_std::allocator<unsigned_long>_> local_328;
  undefined1 local_2f8 [8];
  const_iterator it_2;
  undefined1 local_2b0 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_2;
  undefined1 local_268 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  reverse_iterator local_248;
  bool local_216;
  bool local_215;
  int local_214;
  undefined1 local_210 [4];
  int i_1;
  undefined1 local_1e0 [8];
  reverse_iterator it_1;
  undefined1 local_198 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_150 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  iterator local_130;
  bool local_fe;
  bool local_fd;
  int local_fc;
  undefined1 local_f8 [4];
  int i;
  undefined1 local_c8 [8];
  iterator it;
  undefined1 local_80 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  ViewTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  paVar1 = (allocator<int> *)
           ((long)&it.coordinates_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_80,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_f8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_f8);
  for (local_fc = 0; local_fc < 0x18; local_fc = local_fc + 1) {
    piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
    local_fd = *piVar6 == this->data_[local_fc];
    test(&local_fd);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_130,(View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  local_fe = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                       ((Iterator<int,false,std::allocator<unsigned_long>> *)local_c8,&local_130);
  test(&local_fe);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_130);
  pIVar7 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(pIVar7);
  shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == 0x17;
  test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_c8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  puVar2 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
  paVar1 = (allocator<int> *)
           ((long)&it_1.current.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_198,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_1.current.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
  reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                    *)local_1e0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::rbegin
            ((reverse_iterator *)local_210,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_198);
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::operator=
            ((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_> *)
             local_1e0,
             (reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_> *)
             local_210);
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                     *)local_210);
  for (local_214 = 0x17; -1 < local_214; local_214 = local_214 + -1) {
    piVar8 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
             operator*((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                        *)local_1e0);
    local_215 = *piVar8 == this->data_[local_214];
    test(&local_215);
    std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::operator++
              ((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_> *)
               local_1e0);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::rend
            (&local_248,(View<int,_false,_std::allocator<unsigned_long>_> *)local_198);
  local_216 = std::operator==((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                               *)local_1e0,&local_248);
  test(&local_216);
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator(&local_248);
  prVar9 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
           operator--((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                       *)local_1e0);
  piVar8 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
           operator*(prVar9);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0;
  test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                     *)local_1e0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_198);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_150);
  puVar2 = &v_2.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268,1,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_2.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268,0);
  *pvVar3 = 0x18;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268);
  paVar1 = (allocator<int> *)
           ((long)&it_2.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_2b0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_2.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_358,(View<int,_false,_std::allocator<unsigned_long>_> *)local_2b0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_328,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_358);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8,&local_328);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_328);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_358);
  for (local_35c = 0; local_35c < 0x18; local_35c = local_35c + 1) {
    piVar10 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
    local_35d = *piVar10 == this->data_[local_35c];
    test(&local_35d);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_390,(View<int,_false,_std::allocator<unsigned_long>_> *)local_2b0);
  local_35e = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_2f8,&local_390);
  test(&local_35e);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_390);
  pIVar11 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
  piVar10 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar11);
  shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar10 == 0x17;
  test((bool *)((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_2f8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_2b0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_268);
  puVar2 = &v_3.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3b0,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_3.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3b0,0);
  *pvVar3 = 6;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3b0,1);
  *pvVar3 = 4;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3b0);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3b0);
  paVar1 = (allocator<int> *)
           ((long)&it_3.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_3f8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_3.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_440);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_470,(View<int,_false,_std::allocator<unsigned_long>_> *)local_3f8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_440,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_470);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_470);
  for (local_474 = 0; local_474 < 0x18; local_474 = local_474 + 1) {
    piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_440);
    local_475 = *piVar6 == this->data_[local_474];
    test(&local_475);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_440);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_4a8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_3f8);
  local_476 = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,false,std::allocator<unsigned_long>> *)local_440,&local_4a8);
  test(&local_476);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_4a8);
  pIVar7 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_440);
  piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(pIVar7);
  shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == 0x17;
  test((bool *)((long)&shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_440);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_3f8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3b0);
  puVar2 = &v_4.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c8,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_4.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c8,0);
  *pvVar3 = 6;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c8,1);
  *pvVar3 = 4;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c8);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c8);
  paVar1 = (allocator<int> *)
           ((long)&it_4.current.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_510,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_4.current.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
  reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                    *)local_558);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::rbegin
            ((reverse_iterator *)local_588,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_510);
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::operator=
            ((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_> *)
             local_558,
             (reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_> *)
             local_588);
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                     *)local_588);
  for (local_58c = 0x17; -1 < local_58c; local_58c = local_58c + -1) {
    piVar8 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
             operator*((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                        *)local_558);
    local_58d = *piVar8 == this->data_[local_58c];
    test(&local_58d);
    std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::operator++
              ((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_> *)
               local_558);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::rend
            (&local_5c0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_510);
  local_58e = std::operator==((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                               *)local_558,&local_5c0);
  test(&local_58e);
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator(&local_5c0);
  prVar9 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
           operator--((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                       *)local_558);
  piVar8 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
           operator*(prVar9);
  shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0;
  test((bool *)((long)&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                     *)local_558);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_510);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c8);
  puVar2 = &v_5.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5e0,2,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_5.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5e0,0);
  *pvVar3 = 6;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5e0,1);
  *pvVar3 = 4;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5e0);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5e0);
  paVar1 = (allocator<int> *)
           ((long)&it_5.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_628,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_5.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_670);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_6d0,(View<int,_false,_std::allocator<unsigned_long>_> *)local_628);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_6a0,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_6d0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_670,&local_6a0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_6a0);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_6d0);
  for (local_6d4 = 0; local_6d4 < 0x18; local_6d4 = local_6d4 + 1) {
    piVar10 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_670);
    local_6d5 = *piVar10 == this->data_[local_6d4];
    test(&local_6d5);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_670);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_708,(View<int,_false,_std::allocator<unsigned_long>_> *)local_628);
  local_6d6 = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_670,&local_708);
  test(&local_6d6);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_708);
  pIVar11 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_670);
  piVar10 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar11);
  shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar10 == 0x17;
  test((bool *)((long)&shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_670);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_628);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_5e0);
  puVar2 = &v_6.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_728,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_6.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_728,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_728,1);
  *pvVar3 = 4;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_728,2);
  *pvVar3 = 2;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_728);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_728);
  paVar1 = (allocator<int> *)
           ((long)&it_6.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_770,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_6.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_7b8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_7e8,(View<int,_false,_std::allocator<unsigned_long>_> *)local_770);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_7b8,
             (Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_7e8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_7e8);
  for (local_7ec = 0; local_7ec < 0x18; local_7ec = local_7ec + 1) {
    piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*
                       ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_7b8);
    local_7ed = *piVar6 == this->data_[local_7ec];
    test(&local_7ed);
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_7b8);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_820,(View<int,_false,_std::allocator<unsigned_long>_> *)local_770);
  local_7ee = andres::Iterator<int,false,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,false,std::allocator<unsigned_long>> *)local_7b8,&local_820);
  test(&local_7ee);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_820);
  pIVar7 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
                     ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_7b8);
  piVar6 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator*(pIVar7);
  shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == 0x17;
  test((bool *)((long)&shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_7b8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_770);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_728);
  puVar2 = &v_7.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_840,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_7.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_840,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_840,1);
  *pvVar3 = 4;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_840,2);
  *pvVar3 = 2;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_840);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_840);
  paVar1 = (allocator<int> *)
           ((long)&it_7.current.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_888,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_7.current.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
  reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                    *)local_8d0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::rbegin
            ((reverse_iterator *)local_900,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_888);
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::operator=
            ((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_> *)
             local_8d0,
             (reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_> *)
             local_900);
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                     *)local_900);
  for (local_904 = 0x17; -1 < local_904; local_904 = local_904 + -1) {
    piVar8 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
             operator*((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                        *)local_8d0);
    local_905 = *piVar8 == this->data_[local_904];
    test(&local_905);
    std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::operator++
              ((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_> *)
               local_8d0);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::rend
            (&local_938,(View<int,_false,_std::allocator<unsigned_long>_> *)local_888);
  local_906 = std::operator==((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                               *)local_8d0,&local_938);
  test(&local_906);
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator(&local_938);
  prVar9 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
           operator--((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                       *)local_8d0);
  piVar8 = std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
           operator*(prVar9);
  shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar8 == 0;
  test((bool *)((long)&shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>::
  ~reverse_iterator((reverse_iterator<andres::Iterator<int,_false,_std::allocator<unsigned_long>_>_>
                     *)local_8d0);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_888);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_840);
  puVar2 = &v_8.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958,3,
             (allocator_type *)puVar2);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_8.geometry_.field_0x37);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958,0);
  *pvVar3 = 3;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958,1);
  *pvVar3 = 4;
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958,2);
  *pvVar3 = 2;
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958);
  iVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958);
  paVar1 = (allocator<int> *)
           ((long)&it_8.coordinates_.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_9a0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar5._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&it_8.coordinates_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_9e8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::begin
            ((iterator *)local_a48,(View<int,_false,_std::allocator<unsigned_long>_> *)local_9a0);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
            (&local_a18,(Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_a48);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator=
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_9e8,&local_a18);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator(&local_a18);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_a48);
  for (local_a4c = 0; local_a4c < 0x18; local_a4c = local_a4c + 1) {
    piVar10 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*
                        ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_9e8);
    local_a4d = *piVar10 == this->data_[local_a4c];
    test(&local_a4d);
    andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_9e8);
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::end
            (&local_a80,(View<int,_false,_std::allocator<unsigned_long>_> *)local_9a0);
  local_a4e = andres::Iterator<int,true,std::allocator<unsigned_long>>::operator==
                        ((Iterator<int,true,std::allocator<unsigned_long>> *)local_9e8,&local_a80);
  test(&local_a4e);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::~Iterator(&local_a80);
  pIVar11 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_9e8);
  piVar10 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator*(pIVar11);
  local_a81 = *piVar10 == 0x17;
  test(&local_a81);
  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::~Iterator
            ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_9e8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9a0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_958);
  return;
}

Assistant:

void ViewTest::iteratorAccessTest(){
    // 1D
    {
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // const
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
    // 2D
    {
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // const
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
    // 3D
    {
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
        // reverse
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::reverse_iterator it;
            it = v.rbegin();
            for(int i = 23; i >= 0; --i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.rend());
            test(*(--it)==0);
        }
        // cosnt
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2;
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            typename andres::View<int, constTarget>::const_iterator it;
            it = v.begin();
            for(int i = 0; i < 24; ++i){
                test(*it == data_[i]);
                ++it;
            }
            test(it == v.end());
            test(*(--it)==23);
        }
    }
}